

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signature.c
# Opt level: O0

int ndn_signature_info_tlv_decode(ndn_decoder_t *decoder,ndn_signature_t *signature)

{
  int iVar1;
  int iVar2;
  uint32_t local_2c;
  uint32_t value_starting;
  uint32_t value_length;
  uint32_t probe;
  int ret_val;
  ndn_signature_t *signature_local;
  ndn_decoder_t *decoder_local;
  
  value_length = 0xffffffff;
  _probe = signature;
  signature_local = (ndn_signature_t *)decoder;
  ndn_signature_init(signature,false);
  value_starting = 0;
  value_length = decoder_get_type((ndn_decoder_t *)signature_local,&value_starting);
  decoder_local._4_4_ = value_length;
  if (value_length == 0) {
    if (value_starting == 0x16) {
      _probe->is_interest = false;
    }
    else {
      if (value_starting != 0x2c) {
        return -0xc;
      }
      _probe->is_interest = true;
    }
    local_2c = 0;
    value_length = decoder_get_length((ndn_decoder_t *)signature_local,&local_2c);
    decoder_local._4_4_ = value_length;
    if (value_length == 0) {
      iVar1 = *(int *)(signature_local->sig_value + 0xb);
      value_length = decoder_get_type((ndn_decoder_t *)signature_local,&value_starting);
      decoder_local._4_4_ = value_length;
      if ((value_length == 0) &&
         (value_length = decoder_get_length((ndn_decoder_t *)signature_local,&value_starting),
         decoder_local._4_4_ = value_length, value_length == 0)) {
        decoder_local._4_4_ =
             decoder_get_byte_value((ndn_decoder_t *)signature_local,&_probe->sig_type);
joined_r0x00115ee6:
        if (decoder_local._4_4_ == 0) {
          do {
            value_length = 0;
            if (iVar1 + local_2c <= *(uint *)(signature_local->sig_value + 0xb)) {
              return 0;
            }
            value_length = decoder_get_type((ndn_decoder_t *)signature_local,&value_starting);
            if (value_length != 0) {
              return value_length;
            }
            if (value_starting == 0x1c) {
              _probe->enable_KeyLocator = '\x01';
              value_length = decoder_get_length((ndn_decoder_t *)signature_local,&value_starting);
              if (value_length != 0) {
                return value_length;
              }
              iVar2 = ndn_name_tlv_decode((ndn_decoder_t *)signature_local,&_probe->key_locator_name
                                         );
            }
            else if (value_starting == 0xfd) {
              _probe->enable_ValidityPeriod = '\x01';
              value_length = decoder_get_length((ndn_decoder_t *)signature_local,&value_starting);
              if (value_length != 0) {
                return value_length;
              }
              value_length = decoder_get_type((ndn_decoder_t *)signature_local,&value_starting);
              if (value_length != 0) {
                return value_length;
              }
              value_length = decoder_get_length((ndn_decoder_t *)signature_local,&value_starting);
              if (value_length != 0) {
                return value_length;
              }
              value_length = decoder_get_raw_buffer_value
                                       ((ndn_decoder_t *)signature_local,
                                        (_probe->validity_period).not_before,0xf);
              if (value_length != 0) {
                return value_length;
              }
              value_length = decoder_get_type((ndn_decoder_t *)signature_local,&value_starting);
              if (value_length != 0) {
                return value_length;
              }
              value_length = decoder_get_length((ndn_decoder_t *)signature_local,&value_starting);
              if (value_length != 0) {
                return value_length;
              }
              iVar2 = decoder_get_raw_buffer_value
                                ((ndn_decoder_t *)signature_local,
                                 (_probe->validity_period).not_after,0xf);
            }
            else {
              if (value_starting == 10) goto code_r0x001160b0;
              if (value_starting == 0x28) {
                _probe->enable_Timestamp = '\x01';
                value_length = decoder_get_length((ndn_decoder_t *)signature_local,&value_starting);
                if (value_length != 0) {
                  return value_length;
                }
                iVar2 = decoder_get_uint_value
                                  ((ndn_decoder_t *)signature_local,value_starting,
                                   &_probe->timestamp);
              }
              else {
                if (value_starting != 0x2a) {
                  return -0xc;
                }
                _probe->enable_Seqnum = '\x01';
                value_length = decoder_get_length((ndn_decoder_t *)signature_local,&value_starting);
                if (value_length != 0) {
                  return value_length;
                }
                iVar2 = decoder_get_uint_value
                                  ((ndn_decoder_t *)signature_local,value_starting,&_probe->seqnum);
              }
            }
            if (iVar2 != 0) {
              return iVar2;
            }
          } while( true );
        }
      }
    }
  }
  return decoder_local._4_4_;
code_r0x001160b0:
  _probe->enable_SignatureNonce = '\x01';
  value_length = decoder_get_length((ndn_decoder_t *)signature_local,&value_starting);
  if (value_length != 0) {
    return value_length;
  }
  if (value_starting != 4) {
    return -0xd;
  }
  decoder_local._4_4_ =
       decoder_get_uint32_value((ndn_decoder_t *)signature_local,&_probe->signature_nonce);
  goto joined_r0x00115ee6;
}

Assistant:

int
ndn_signature_info_tlv_decode(ndn_decoder_t* decoder, ndn_signature_t* signature)
{
  int ret_val = -1;
  ndn_signature_init(signature, false);

  uint32_t probe = 0;
  ret_val = decoder_get_type(decoder, &probe);
  if (ret_val != NDN_SUCCESS) return ret_val;
  if (probe == TLV_SignatureInfo) {
    signature->is_interest = false;
  }
  else if (probe == TLV_InterestSignatureInfo) {
    signature->is_interest = true;
  }
  else {
    return NDN_WRONG_TLV_TYPE;
  }
  uint32_t value_length = 0;
  ret_val = decoder_get_length(decoder, &value_length);
  if (ret_val != NDN_SUCCESS) return ret_val;
  uint32_t value_starting = decoder->offset;

  // signature type
  ret_val = decoder_get_type(decoder, &probe);
  if (ret_val != NDN_SUCCESS) return ret_val;
  ret_val = decoder_get_length(decoder, &probe);
  if (ret_val != NDN_SUCCESS) return ret_val;
  ret_val = decoder_get_byte_value(decoder, &signature->sig_type);
  if (ret_val != NDN_SUCCESS) return ret_val;

  while (decoder->offset < value_starting + value_length) {
    ret_val = decoder_get_type(decoder, &probe);
    if (ret_val != NDN_SUCCESS) return ret_val;
    if (probe == TLV_KeyLocator) {
      signature->enable_KeyLocator = 1;
      ret_val = decoder_get_length(decoder, &probe);
      if (ret_val != NDN_SUCCESS) return ret_val;
      ret_val = ndn_name_tlv_decode(decoder, &signature->key_locator_name);
      if (ret_val != NDN_SUCCESS) return ret_val;
    }
    else if (probe == TLV_ValidityPeriod) {
      signature->enable_ValidityPeriod = 1;
      ret_val = decoder_get_length(decoder, &probe);
      if (ret_val != NDN_SUCCESS) return ret_val;

      ret_val = decoder_get_type(decoder, &probe);
      if (ret_val != NDN_SUCCESS) return ret_val;
      ret_val = decoder_get_length(decoder, &probe);
      if (ret_val != NDN_SUCCESS) return ret_val;
      ret_val = decoder_get_raw_buffer_value(decoder, signature->validity_period.not_before, 15);
      if (ret_val != NDN_SUCCESS) return ret_val;

      ret_val = decoder_get_type(decoder, &probe);
      if (ret_val != NDN_SUCCESS) return ret_val;
      ret_val = decoder_get_length(decoder, &probe);
      if (ret_val != NDN_SUCCESS) return ret_val;
      ret_val = decoder_get_raw_buffer_value(decoder, signature->validity_period.not_after, 15);
      if (ret_val != NDN_SUCCESS) return ret_val;
    }
    else if (probe == TLV_Nonce) {
      signature->enable_SignatureNonce = 1;
      ret_val = decoder_get_length(decoder, &probe);
      if (ret_val != NDN_SUCCESS) return ret_val;
      if (probe != 4) {
        return NDN_WRONG_TLV_LENGTH;
      }
      ret_val = decoder_get_uint32_value(decoder, &signature->signature_nonce);
      if (ret_val != NDN_SUCCESS) return ret_val;
    }
    else if (probe == TLV_Timestamp) {
      signature->enable_Timestamp = 1;
      ret_val = decoder_get_length(decoder, &probe);
      if (ret_val != NDN_SUCCESS) return ret_val;
      ret_val = decoder_get_uint_value(decoder, probe, &signature->timestamp);
      if (ret_val != NDN_SUCCESS) return ret_val;
    }
    else if (probe == TLV_SeqNum) {
      signature->enable_Seqnum = 1;
      ret_val = decoder_get_length(decoder, &probe);
      if (ret_val != NDN_SUCCESS) return ret_val;
      ret_val = decoder_get_uint_value(decoder, probe, &signature->seqnum);
      if (ret_val != NDN_SUCCESS) return ret_val;
    }
    else
      return NDN_WRONG_TLV_TYPE;
  }
  return 0;
}